

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O0

void __thiscall HighsSimplexAnalysis::reportIterationData(HighsSimplexAnalysis *this,bool header)

{
  type pbVar1;
  byte in_SIL;
  long in_RDI;
  unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffef0;
  string *psVar2;
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [48];
  string local_30 [39];
  byte local_9;
  
  local_9 = in_SIL & 1;
  if (local_9 == 0) {
    if (*(int *)(in_RDI + 0x10c) < 0) {
      pbVar1 = std::
               unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(in_stack_fffffffffffffef0);
      psVar2 = local_c0;
      highsFormatToString_abi_cxx11_
                (*(char **)(in_RDI + 0x170),*(undefined8 *)(in_RDI + 0x168),psVar2,
                 " %7d %7d %7d %11.4g %11.4g                                    ",
                 (ulong)*(uint *)(in_RDI + 0x114),(ulong)*(uint *)(in_RDI + 0x110),
                 (ulong)*(uint *)(in_RDI + 0x10c));
      std::operator<<((ostream *)(pbVar1 + 0x10),psVar2);
      std::__cxx11::string::~string(local_c0);
    }
    else {
      pbVar1 = std::
               unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(in_stack_fffffffffffffef0);
      highsFormatToString_abi_cxx11_
                ((char *)local_60," %7d %7d %7d",(ulong)*(uint *)(in_RDI + 0x114),
                 (ulong)*(uint *)(in_RDI + 0x110),(ulong)*(uint *)(in_RDI + 0x10c));
      std::operator<<((ostream *)(pbVar1 + 0x10),local_60);
      std::__cxx11::string::~string(local_60);
      if (*(int *)(in_RDI + 0x114) < 0) {
        pbVar1 = std::
                 unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*(in_stack_fffffffffffffef0);
        highsFormatToString_abi_cxx11_
                  (*(char **)(in_RDI + 0x160),local_a0,
                   "                         %11.4g                        ");
        std::operator<<((ostream *)(pbVar1 + 0x10),local_a0);
        std::__cxx11::string::~string(local_a0);
      }
      else {
        pbVar1 = std::
                 unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*(in_stack_fffffffffffffef0);
        highsFormatToString_abi_cxx11_
                  (*(char **)(in_RDI + 0x170),*(undefined8 *)(in_RDI + 0x168),
                   *(undefined8 *)(in_RDI + 0x160),*(undefined8 *)(in_RDI + 400),
                   *(undefined8 *)(in_RDI + 0x178),local_80," %11.4g %11.4g %11.4g %11.4g %11.4g");
        std::operator<<((ostream *)(pbVar1 + 0x10),local_80);
        std::__cxx11::string::~string(local_80);
      }
    }
  }
  else {
    pbVar1 = std::
             unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(in_stack_fffffffffffffef0);
    highsFormatToString_abi_cxx11_
              ((char *)local_30,
               "     EnC     LvC     LvR        ThDu        ThPr        DlPr       NumCk          Aa"
              );
    std::operator<<((ostream *)(pbVar1 + 0x10),local_30);
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::reportIterationData(const bool header) {
  if (header) {
    *analysis_log << highsFormatToString(
        "     EnC     LvC     LvR        ThDu        ThPr        "
        "DlPr       NumCk          Aa");
  } else if (pivotal_row_index >= 0) {
    *analysis_log << highsFormatToString(
        " %7" HIGHSINT_FORMAT " %7" HIGHSINT_FORMAT " %7" HIGHSINT_FORMAT,
        entering_variable, leaving_variable, pivotal_row_index);
    if (entering_variable >= 0) {
      *analysis_log << highsFormatToString(
          " %11.4g %11.4g %11.4g %11.4g %11.4g", dual_step, primal_step,
          primal_delta, numerical_trouble, pivot_value_from_column);
    } else {
      // Unboundedness in dual simplex
      assert(dualAlgorithm());
      *analysis_log << highsFormatToString(
          "                         %11.4g                        ",
          primal_delta);
    }
  } else {
    // Bound swap in primal simplex
    assert(!dualAlgorithm());
    *analysis_log << highsFormatToString(
        " %7" HIGHSINT_FORMAT " %7" HIGHSINT_FORMAT " %7" HIGHSINT_FORMAT
        " %11.4g %11.4g                                    ",
        entering_variable, leaving_variable, pivotal_row_index, dual_step,
        primal_step);
  }
}